

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_tcp.c
# Opt level: O2

int main(void)

{
  ushort *puVar1;
  byte *pbVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  tnt_stream *ptVar8;
  tnt_stream *ptVar9;
  ssize_t sVar10;
  tnt_request *ptVar11;
  int64_t iVar12;
  int64_t iVar13;
  tnt_reply *ptVar14;
  tnt_iter *ptVar15;
  tnt_iter *ptVar16;
  uint64_t uVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  undefined8 uVar21;
  uint64_t uVar22;
  char acStack_188 [8];
  char uri [128];
  char *pos;
  byte local_b8;
  long local_b0;
  byte *local_90;
  undefined8 local_50;
  byte *local_40;
  uint32_t str_len;
  uint32_t local_34 [2];
  uint32_t str_len_1;
  
  plan(0xb);
  uri[0x68] = '\0';
  uri[0x69] = '\0';
  uri[0x6a] = '\0';
  uri[0x6b] = '\0';
  uri[0x6c] = '\0';
  uri[0x6d] = '\0';
  uri[0x6e] = '\0';
  uri[0x6f] = '\0';
  uri[0x70] = '\0';
  uri[0x71] = '\0';
  uri[0x72] = '\0';
  uri[0x73] = '\0';
  uri[0x74] = '\0';
  uri[0x75] = '\0';
  uri[0x76] = '\0';
  uri[0x77] = '\0';
  uri[0x58] = '\0';
  uri[0x59] = '\0';
  uri[0x5a] = '\0';
  uri[0x5b] = '\0';
  uri[0x5c] = '\0';
  uri[0x5d] = '\0';
  uri[0x5e] = '\0';
  uri[0x5f] = '\0';
  uri[0x60] = '\0';
  uri[0x61] = '\0';
  uri[0x62] = '\0';
  uri[99] = '\0';
  uri[100] = '\0';
  uri[0x65] = '\0';
  uri[0x66] = '\0';
  uri[0x67] = '\0';
  uri[0x48] = '\0';
  uri[0x49] = '\0';
  uri[0x4a] = '\0';
  uri[0x4b] = '\0';
  uri[0x4c] = '\0';
  uri[0x4d] = '\0';
  uri[0x4e] = '\0';
  uri[0x4f] = '\0';
  uri[0x50] = '\0';
  uri[0x51] = '\0';
  uri[0x52] = '\0';
  uri[0x53] = '\0';
  uri[0x54] = '\0';
  uri[0x55] = '\0';
  uri[0x56] = '\0';
  uri[0x57] = '\0';
  uri[0x38] = '\0';
  uri[0x39] = '\0';
  uri[0x3a] = '\0';
  uri[0x3b] = '\0';
  uri[0x3c] = '\0';
  uri[0x3d] = '\0';
  uri[0x3e] = '\0';
  uri[0x3f] = '\0';
  uri[0x40] = '\0';
  uri[0x41] = '\0';
  uri[0x42] = '\0';
  uri[0x43] = '\0';
  uri[0x44] = '\0';
  uri[0x45] = '\0';
  uri[0x46] = '\0';
  uri[0x47] = '\0';
  uri[0x28] = '\0';
  uri[0x29] = '\0';
  uri[0x2a] = '\0';
  uri[0x2b] = '\0';
  uri[0x2c] = '\0';
  uri[0x2d] = '\0';
  uri[0x2e] = '\0';
  uri[0x2f] = '\0';
  uri[0x30] = '\0';
  uri[0x31] = '\0';
  uri[0x32] = '\0';
  uri[0x33] = '\0';
  uri[0x34] = '\0';
  uri[0x35] = '\0';
  uri[0x36] = '\0';
  uri[0x37] = '\0';
  uri[0x18] = '\0';
  uri[0x19] = '\0';
  uri[0x1a] = '\0';
  uri[0x1b] = '\0';
  uri[0x1c] = '\0';
  uri[0x1d] = '\0';
  uri[0x1e] = '\0';
  uri[0x1f] = '\0';
  uri[0x20] = '\0';
  uri[0x21] = '\0';
  uri[0x22] = '\0';
  uri[0x23] = '\0';
  uri[0x24] = '\0';
  uri[0x25] = '\0';
  uri[0x26] = '\0';
  uri[0x27] = '\0';
  uri[8] = '\0';
  uri[9] = '\0';
  uri[10] = '\0';
  uri[0xb] = '\0';
  uri[0xc] = '\0';
  uri[0xd] = '\0';
  uri[0xe] = '\0';
  uri[0xf] = '\0';
  uri[0x10] = '\0';
  uri[0x11] = '\0';
  uri[0x12] = '\0';
  uri[0x13] = '\0';
  uri[0x14] = '\0';
  uri[0x15] = '\0';
  uri[0x16] = '\0';
  uri[0x17] = '\0';
  acStack_188[0] = '\0';
  acStack_188[1] = '\0';
  acStack_188[2] = '\0';
  acStack_188[3] = '\0';
  acStack_188[4] = '\0';
  acStack_188[5] = '\0';
  acStack_188[6] = '\0';
  acStack_188[7] = '\0';
  uri[0] = '\0';
  uri[1] = '\0';
  uri[2] = '\0';
  uri[3] = '\0';
  uri[4] = '\0';
  uri[5] = '\0';
  uri[6] = '\0';
  uri[7] = '\0';
  pcVar7 = getenv("LISTEN");
  snprintf(acStack_188,0x80,"test:test@%s",pcVar7);
  plan(7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_connect_tcp");
  fputc(10,_stdout);
  ptVar8 = tnt_net((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Checking that stream is allocated");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Checking that stream is allocated",0x21,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x44);
  }
  iVar4 = __ok((uint)(ptVar8->alloc == 1),"Checking s->alloc");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Checking s->alloc",0x11,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x45);
  }
  iVar4 = tnt_set(ptVar8,0,acStack_188);
  iVar4 = __ok((uint)(iVar4 != -1),"Setting URI");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Setting URI",0xb,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x46);
  }
  iVar4 = tnt_connect(ptVar8);
  iVar4 = __ok((uint)(iVar4 != -1),"Connecting");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Connecting",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x47);
  }
  tnt_close(ptVar8);
  tnt_stream_free(ptVar8);
  uri[0x78] = '\0';
  uri[0x79] = '\0';
  uri[0x7a] = '\0';
  uri[0x7b] = '\0';
  uri[0x7c] = '\0';
  uri[0x7d] = '\0';
  uri[0x7e] = '\0';
  uri[0x7f] = '\0';
  tnt_net((tnt_stream *)(uri + 0x78));
  iVar4 = __ok((uint)(uri._120_4_ == 0),"Checking sa.alloc");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Checking sa.alloc",0x11,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x4d);
  }
  iVar4 = tnt_set((tnt_stream *)(uri + 0x78),0,acStack_188);
  iVar4 = __ok((uint)(iVar4 != -1),"Setting URI");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Setting URI",0xb,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x4e);
  }
  iVar4 = tnt_connect((tnt_stream *)(uri + 0x78));
  iVar4 = __ok((uint)(iVar4 != -1),"Connecting");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Connecting",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x4f);
  }
  tnt_close((tnt_stream *)(uri + 0x78));
  tnt_stream_free((tnt_stream *)(uri + 0x78));
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_connect_tcp");
  fputc(10,_stdout);
  check_plan();
  test_object();
  plan(5);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_01");
  fputc(10,_stdout);
  ptVar8 = tnt_net((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check connection creation",0x19,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xf3);
  }
  iVar4 = tnt_set(ptVar8,0,acStack_188);
  iVar4 = __ok((uint)(iVar4 != -1),"Setting URI");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Setting URI",0xb,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xf4);
  }
  iVar4 = tnt_connect(ptVar8);
  iVar4 = __ok((uint)(iVar4 != -1),"Connecting");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Connecting",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xf5);
  }
  ptVar9 = tnt_object((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar9 != (tnt_stream *)0x0),"Check object creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check object creation",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xf9);
  }
  sVar10 = tnt_object_add_array(ptVar9,0);
  iVar4 = __ok((uint)(sVar10 == 1),"Append elem");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Append elem",0xb,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xfa);
  }
  ptVar11 = tnt_request_call_16((tnt_request *)0x0);
  tnt_request_set_funcz(ptVar11,"test_4");
  tnt_request_set_tuple(ptVar11,ptVar9);
  iVar12 = tnt_request_compile(ptVar8,ptVar11);
  tnt_request_free(ptVar11);
  ptVar11 = tnt_request_eval((tnt_request *)0x0);
  tnt_request_set_exprz(ptVar11,"return test_4()");
  tnt_request_set_tuple(ptVar11,ptVar9);
  iVar13 = tnt_request_compile(ptVar8,ptVar11);
  tnt_request_free(ptVar11);
  tnt_flush(ptVar8);
  tnt_iter_reply((tnt_iter *)(uri + 0x78),ptVar8);
  while (iVar4 = tnt_next((tnt_iter *)(uri + 0x78)), iVar4 != 0) {
    if ((local_b0 != iVar12) && (local_b0 != iVar13)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                    ,0x112,"int test_request_01(char *)");
    }
  }
  tnt_stream_free(ptVar8);
  tnt_stream_free(ptVar9);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_01");
  fputc(10,_stdout);
  check_plan();
  plan(0xf);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_02");
  fputc(10,_stdout);
  ptVar8 = tnt_net((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check connection creation",0x19,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x123);
  }
  iVar4 = tnt_set(ptVar8,0,acStack_188);
  iVar4 = __ok((uint)(iVar4 != -1),"Setting URI");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Setting URI",0xb,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x124);
  }
  iVar4 = tnt_connect(ptVar8);
  iVar4 = __ok((uint)(iVar4 != -1),"Connecting");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Connecting",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x125);
  }
  ptVar9 = tnt_object((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar9 != (tnt_stream *)0x0),"Check object creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check object creation",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x129);
  }
  sVar10 = tnt_object_add_array(ptVar9,1);
  iVar4 = __ok((uint)(sVar10 == 1),"Create key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Create key",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x12a);
  }
  sVar10 = tnt_object_add_strz(ptVar9,"_vspace");
  iVar4 = __ok((uint)(sVar10 == 8),"Create key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Create key",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,299);
  }
  ptVar11 = tnt_request_select((tnt_request *)0x0);
  iVar4 = __ok((uint)(ptVar11 != (tnt_request *)0x0),"Check request creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check request creation",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x12f);
  }
  iVar4 = __ok((uint)((ptVar11->hdr).type == TNT_OP_SELECT),"Check that we inited select");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check that we inited select",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x130);
  }
  iVar4 = tnt_request_set_space(ptVar11,0x119);
  iVar4 = __ok((uint)(iVar4 == 0),"Set space");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set space",9,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x131);
  }
  iVar4 = tnt_request_set_index(ptVar11,2);
  iVar4 = __ok((uint)(iVar4 == 0),"Set index");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set index",9,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x132);
  }
  iVar4 = tnt_request_set_key(ptVar11,ptVar9);
  iVar4 = __ok((uint)(iVar4 == 0),"Set key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set key",7,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x133);
  }
  iVar12 = tnt_request_compile(ptVar8,ptVar11);
  iVar4 = __ok((uint)(iVar12 != -1),"Compile request");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Compile request",0xf,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x134);
  }
  sVar10 = tnt_flush(ptVar8);
  iVar4 = __ok((uint)(sVar10 != -1),"Send package to server");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Send package to server",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x136);
  }
  tnt_request_free(ptVar11);
  tnt_stream_free(ptVar9);
  ptVar14 = tnt_reply_init((tnt_reply *)(uri + 0x78));
  iVar4 = __ok((uint)(ptVar14 != (tnt_reply *)0x0),"Init reply");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Init reply",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x13b);
  }
  iVar4 = (*ptVar8->read_reply)(ptVar8,(tnt_reply *)(uri + 0x78));
  iVar4 = __ok((uint)(iVar4 != -1),"Read reply");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Read reply",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x13c);
  }
  tnt_reply_free((tnt_reply *)(uri + 0x78));
  tnt_stream_free(ptVar8);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_02");
  fputc(10,_stdout);
  check_plan();
  plan(0xf);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_03");
  fputc(10,_stdout);
  ptVar8 = tnt_net((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check connection creation",0x19,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x14c);
  }
  iVar4 = tnt_set(ptVar8,0,acStack_188);
  iVar4 = __ok((uint)(iVar4 != -1),"Setting URI");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Setting URI",0xb,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x14d);
  }
  iVar4 = tnt_connect(ptVar8);
  iVar4 = __ok((uint)(iVar4 != -1),"Connecting");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Connecting",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x14e);
  }
  ptVar9 = tnt_object((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar9 != (tnt_stream *)0x0),"Check object creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check object creation",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x152);
  }
  sVar10 = tnt_object_add_array(ptVar9,1);
  iVar4 = __ok((uint)(sVar10 == 1),"Create key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Create key",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x153);
  }
  sVar10 = tnt_object_add_strz(ptVar9,"_vspace");
  iVar4 = __ok((uint)(sVar10 == 8),"Create key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Create key",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x154);
  }
  ptVar11 = tnt_request_select((tnt_request *)0x0);
  iVar4 = __ok((uint)(ptVar11 != (tnt_request *)0x0),"Check request creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check request creation",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x157);
  }
  iVar4 = __ok((uint)((ptVar11->hdr).type == TNT_OP_SELECT),"Check that we inited select");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check that we inited select",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x158);
  }
  iVar4 = tnt_request_set_sspace(ptVar8,ptVar11,"_vspace",7);
  iVar4 = __ok((uint)(iVar4 == 0),"Set space");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set space",9,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x159);
  }
  iVar4 = tnt_request_set_sindex(ptVar8,ptVar11,"name",4);
  iVar4 = __ok((uint)(iVar4 == 0),"Set index");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set index",9,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x15a);
  }
  iVar4 = tnt_request_set_key(ptVar11,ptVar9);
  iVar4 = __ok((uint)(iVar4 == 0),"Set key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set key",7,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x15b);
  }
  iVar12 = tnt_request_compile(ptVar8,ptVar11);
  iVar4 = __ok((uint)(iVar12 != -1),"Compile request");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Compile request",0xf,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x15c);
  }
  sVar10 = tnt_flush(ptVar8);
  iVar4 = __ok((uint)(sVar10 != -1),"Send package to server");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Send package to server",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x15e);
  }
  tnt_request_free(ptVar11);
  tnt_stream_free(ptVar9);
  ptVar14 = tnt_reply_init((tnt_reply *)(uri + 0x78));
  iVar4 = __ok((uint)(ptVar14 != (tnt_reply *)0x0),"Init reply");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Init reply",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x163);
  }
  iVar4 = (*ptVar8->read_reply)(ptVar8,(tnt_reply *)(uri + 0x78));
  iVar4 = __ok((uint)(iVar4 != -1),"Read reply");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Read reply",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x164);
  }
  tnt_reply_free((tnt_reply *)(uri + 0x78));
  tnt_stream_free(ptVar8);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_03");
  fputc(10,_stdout);
  check_plan();
  plan(0x12);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_04");
  fputc(10,_stdout);
  ptVar8 = tnt_net((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check connection creation",0x19,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x175);
  }
  iVar4 = tnt_set(ptVar8,0,acStack_188);
  iVar4 = __ok((uint)(iVar4 != -1),"Setting URI");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Setting URI",0xb,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x176);
  }
  iVar4 = tnt_connect(ptVar8);
  iVar4 = __ok((uint)(iVar4 != -1),"Connecting");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Connecting",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x177);
  }
  ptVar9 = tnt_object((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar9 != (tnt_stream *)0x0),"Check object creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check object creation",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x17b);
  }
  sVar10 = tnt_object_add_array(ptVar9,1);
  iVar4 = __ok((uint)(sVar10 == 1),"Create key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Create key",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x17c);
  }
  sVar10 = tnt_object_add_strz(ptVar9,"_vspace");
  iVar4 = __ok((uint)(sVar10 == 8),"Create key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Create key",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x17d);
  }
  ptVar11 = tnt_request_select((tnt_request *)0x0);
  iVar4 = __ok((uint)(ptVar11 != (tnt_request *)0x0),"Check request creation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check request creation",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x180);
  }
  iVar4 = __ok((uint)((ptVar11->hdr).type == TNT_OP_SELECT),"Check that we inited select");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check that we inited select",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x181);
  }
  iVar4 = tnt_request_set_sspace(ptVar8,ptVar11,"_vspace",7);
  iVar4 = __ok((uint)(iVar4 == 0),"Set space");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set space",9,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x182);
  }
  iVar4 = tnt_request_set_sindex(ptVar8,ptVar11,"name",4);
  iVar4 = __ok((uint)(iVar4 == 0),"Set index");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set index",9,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x183);
  }
  iVar4 = tnt_request_set_key(ptVar11,ptVar9);
  iVar4 = __ok((uint)(iVar4 == 0),"Set key");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set key",7,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x184);
  }
  iVar4 = tnt_request_set_offset(ptVar11,1);
  iVar4 = __ok((uint)(iVar4 == 0),"Set offset");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set offset",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x185);
  }
  iVar4 = tnt_request_set_limit(ptVar11,1);
  iVar4 = __ok((uint)(iVar4 == 0),"Set limit");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set limit",9,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x186);
  }
  iVar4 = tnt_request_set_iterator(ptVar11,TNT_ITER_GT);
  iVar4 = __ok((uint)(iVar4 == 0),"Set iterator");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Set iterator",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x187);
  }
  iVar12 = tnt_request_compile(ptVar8,ptVar11);
  iVar4 = __ok((uint)(iVar12 != -1),"Compile request");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Compile request",0xf,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x188);
  }
  sVar10 = tnt_flush(ptVar8);
  iVar4 = __ok((uint)(sVar10 != -1),"Send package to server");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Send package to server",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x189);
  }
  tnt_request_free(ptVar11);
  tnt_stream_free(ptVar9);
  ptVar14 = tnt_reply_init((tnt_reply *)(uri + 0x78));
  iVar4 = __ok((uint)(ptVar14 != (tnt_reply *)0x0),"Init reply");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Init reply",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x18e);
  }
  iVar4 = (*ptVar8->read_reply)(ptVar8,(tnt_reply *)(uri + 0x78));
  iVar4 = __ok((uint)(iVar4 != -1),"Read reply");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Read reply",10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,399);
  }
  tnt_reply_free((tnt_reply *)(uri + 0x78));
  tnt_stream_free(ptVar8);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_04");
  fputc(10,_stdout);
  check_plan();
  test_request_05(acStack_188);
  plan(0x20);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_msgpack_array_iter");
  fputc(10,_stdout);
  ptVar8 = tnt_object((tnt_stream *)0x0);
  sVar10 = tnt_object_format(ptVar8,"[%s%d%s%d]","hello",0xb,"world",0xc);
  iVar4 = __ok((uint)(sVar10 != -1),"Pack with format sa");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Pack with format sa",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x27f);
  }
  ptVar15 = tnt_iter_array_object((tnt_iter *)0x0,ptVar8);
  iVar4 = __ok((uint)(ptVar15 != (tnt_iter *)0x0),"check allocation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("check allocation",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x282);
  }
  lVar19 = 0;
  while (iVar4 = tnt_next(ptVar15), iVar4 != 0) {
    local_40 = (byte *)((ulong)local_40 & 0xffffffff00000000);
    uri._120_8_ = (ptVar15->data).array.elem;
    switch(lVar19) {
    case 0:
      iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_STR),"check str type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x288);
      }
      pcVar7 = mp_decode_str((char **)(uri + 0x78),(uint32_t *)&local_40);
      iVar4 = strncmp(pcVar7,"hello",5);
      iVar4 = __ok((uint)(iVar4 == 0),"check str value");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str value",0xf,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x28a);
      }
      iVar4 = __ok((uint)((int)local_40 == 5),"check string length");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check string length",0x13,1,_stderr);
        uVar21 = 0x28b;
LAB_0010679d:
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,uVar21);
      }
      break;
    case 1:
      iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_UINT),"check int type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x28e);
      }
      uVar22 = mp_decode_uint((char **)(uri + 0x78));
      iVar4 = __ok((uint)(uVar22 == 0xb),"check int");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int",9,1,_stderr);
        uVar21 = 0x28f;
        goto LAB_0010679d;
      }
      break;
    case 2:
      iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_STR),"check str type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x292);
      }
      pcVar7 = mp_decode_str((char **)(uri + 0x78),(uint32_t *)&local_40);
      iVar4 = strncmp(pcVar7,"world",5);
      iVar4 = __ok((uint)(iVar4 == 0),"check str value");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str value",0xf,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x294);
      }
      iVar4 = __ok((uint)((int)local_40 == 5),"check string length");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check string length",0x13,1,_stderr);
        uVar21 = 0x295;
        goto LAB_0010679d;
      }
      break;
    case 3:
      iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_UINT),"check int type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x298);
      }
      uVar22 = mp_decode_uint((char **)(uri + 0x78));
      iVar4 = __ok((uint)(uVar22 == 0xc),"check int");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int",9,1,_stderr);
        uVar21 = 0x299;
        goto LAB_0010679d;
      }
      break;
    default:
      iVar4 = __ok(0,"unreacheable section");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("unreacheable section",0x14,1,_stderr);
        uVar21 = 0x29c;
        goto LAB_0010679d;
      }
    }
    lVar19 = lVar19 + 1;
  }
  tnt_iter_free(ptVar15);
  tnt_stream_free(ptVar8);
  ptVar8 = tnt_object((tnt_stream *)0x0);
  sVar10 = tnt_object_format(ptVar8,"[[%d%d] [%d%d] [%d%d]]",1,2,3,4);
  iVar4 = __ok((uint)(sVar10 != -1),"Pack with format aofa",6,5);
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Pack with format aofa",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2a5);
  }
  ptVar15 = tnt_iter_array_object((tnt_iter *)0x0,ptVar8);
  iVar4 = __ok((uint)(ptVar15 != (tnt_iter *)0x0),"check allocation");
  uVar22 = 1;
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("check allocation",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2a7);
  }
  while (iVar4 = tnt_next(ptVar15), iVar4 != 0) {
    pbVar2 = (byte *)(ptVar15->data).array.elem;
    pcVar7 = (ptVar15->data).array.elem_end;
    iVar4 = __ok((uint)(mp_type_hint[*pbVar2] == MP_ARRAY),"check for array");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("check for array",0xf,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x2ac);
    }
    ptVar16 = tnt_iter_array((tnt_iter *)0x0,(char *)pbVar2,(long)pcVar7 - (long)pbVar2);
    iVar4 = __ok((uint)(ptVar16 != (tnt_iter *)0x0),"check allocation");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("check allocation",0x10,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x2ae);
    }
    while (iVar4 = tnt_next(ptVar16), iVar4 != 0) {
      uri._120_8_ = (ptVar16->data).array.elem;
      iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_UINT),"check int type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2b1);
      }
      uVar17 = mp_decode_uint((char **)(uri + 0x78));
      iVar4 = __ok((uint)(uVar22 == uVar17),"check int");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int",9,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2b2);
      }
      uVar22 = uVar22 + 1;
    }
    tnt_iter_free(ptVar16);
  }
  tnt_iter_free(ptVar15);
  tnt_stream_free(ptVar8);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_msgpack_array_iter");
  fputc(10,_stdout);
  check_plan();
  plan(0x22);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_msgpack_mapa_iter");
  fputc(10,_stdout);
  ptVar8 = tnt_object((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"check allocation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("check allocation",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2c5);
  }
  sVar10 = tnt_object_format(ptVar8,"{%s%d%s%d}","hello",0xb,"world",0xc);
  iVar4 = __ok((uint)(sVar10 != -1),"Pack with format s,");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Pack with format s,",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2c7);
  }
  ptVar15 = tnt_iter_map_object((tnt_iter *)0x0,ptVar8);
  iVar4 = __ok((uint)(ptVar15 != (tnt_iter *)0x0),"check allocation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("check allocation",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2cb);
  }
  lVar19 = 0;
  while (iVar4 = tnt_next(ptVar15), iVar4 != 0) {
    local_34[0] = 0;
    uri._120_8_ = (ptVar15->data).array.elem;
    local_40 = (byte *)(ptVar15->data).map.value;
    if (lVar19 == 1) {
      iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_STR),"check str type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2da);
      }
      pcVar7 = mp_decode_str((char **)(uri + 0x78),local_34);
      iVar4 = strncmp(pcVar7,"world",5);
      iVar4 = __ok((uint)(iVar4 == 0),"check str value");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str value",0xf,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2dc);
      }
      iVar4 = __ok((uint)(local_34[0] == 5),"check string length");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check string length",0x13,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2dd);
      }
      iVar4 = __ok((uint)(mp_type_hint[*local_40] == MP_UINT),"check int type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
               );
      }
      uVar22 = mp_decode_uint((char **)&local_40);
      iVar4 = __ok((uint)(uVar22 == 0xc),"check int");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int",9,1,_stderr);
        goto LAB_00107701;
      }
    }
    else if (lVar19 == 0) {
      iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_STR),"check str type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2d2);
      }
      pcVar7 = mp_decode_str((char **)(uri + 0x78),local_34);
      iVar4 = strncmp(pcVar7,"hello",5);
      iVar4 = __ok((uint)(iVar4 == 0),"check str value");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str value",0xf,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2d4);
      }
      iVar4 = __ok((uint)(local_34[0] == 5),"check string length");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check string length",0x13,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2d5);
      }
      iVar4 = __ok((uint)(mp_type_hint[*local_40] == MP_UINT),"check int type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
               );
      }
      uVar22 = mp_decode_uint((char **)&local_40);
      iVar4 = __ok((uint)(uVar22 == 0xb),"check int");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int",9,1,_stderr);
LAB_00107701:
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
               );
      }
    }
    else {
      iVar4 = __ok(0,"unreacheable section");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("unreacheable section",0x14,1,_stderr);
        goto LAB_00107701;
      }
    }
    lVar19 = lVar19 + 1;
  }
  tnt_iter_free(ptVar15);
  tnt_stream_free(ptVar8);
  ptVar8 = tnt_object((tnt_stream *)0x0);
  iVar4 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"check allocation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("check allocation",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2e9);
  }
  sVar10 = tnt_object_format(ptVar8,"{%s [%d%d] %s [%d%d]}","hello",0,1,"world");
  iVar4 = __ok((uint)(sVar10 != -1),"Pack with format aofa",3,2);
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Pack with format aofa",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2ec);
  }
  ptVar15 = tnt_iter_map_object((tnt_iter *)0x0,ptVar8);
  iVar4 = __ok((uint)(ptVar15 != (tnt_iter *)0x0),"check allocation");
  if (iVar4 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("check allocation",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x2ee);
  }
  uVar22 = 0;
  while (iVar4 = tnt_next(ptVar15), iVar4 != 0) {
    uri._120_8_ = (ptVar15->data).array.elem;
    local_34[0] = 0;
    iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_STR),"check str type");
    if (uVar22 == 0) {
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2f4);
      }
      pcVar7 = mp_decode_str((char **)(uri + 0x78),local_34);
      iVar4 = strncmp(pcVar7,"hello",5);
      iVar4 = __ok((uint)(iVar4 == 0),"check str value");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str value",0xf,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2f6);
      }
      iVar4 = __ok((uint)(local_34[0] == 5),"check string length");
      if (iVar4 == 0) {
        local_50 = 0x2f7;
        goto LAB_00107de9;
      }
    }
    else {
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2f9);
      }
      pcVar7 = mp_decode_str((char **)(uri + 0x78),local_34);
      iVar4 = strncmp(pcVar7,"world",5);
      iVar4 = __ok((uint)(iVar4 == 0),"check str value");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check str value",0xf,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x2fb);
      }
      iVar4 = __ok((uint)(local_34[0] == 5),"check string length");
      if (iVar4 == 0) {
        local_50 = 0x2fc;
LAB_00107de9:
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check string length",0x13,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,local_50);
      }
    }
    pbVar2 = (byte *)(ptVar15->data).map.value;
    pcVar7 = (ptVar15->data).map.value_end;
    iVar4 = __ok((uint)(mp_type_hint[*pbVar2] == MP_ARRAY),"check for array");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("check for array",0xf,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x300);
    }
    ptVar16 = tnt_iter_array((tnt_iter *)0x0,(char *)pbVar2,(long)pcVar7 - (long)pbVar2);
    iVar4 = __ok((uint)(ptVar16 != (tnt_iter *)0x0),"check allocation");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("check allocation",0x10,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x302);
    }
    while (iVar4 = tnt_next(ptVar16), iVar4 != 0) {
      local_40 = (byte *)(ptVar16->data).array.elem;
      iVar4 = __ok((uint)(mp_type_hint[*local_40] == MP_UINT),"check int type");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int type",0xe,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x305);
      }
      uVar17 = mp_decode_uint((char **)&local_40);
      iVar4 = __ok((uint)(uVar22 == uVar17),"check int");
      if (iVar4 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("check int",9,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x306);
      }
      uVar22 = uVar22 + 1;
    }
    tnt_iter_free(ptVar16);
  }
  tnt_iter_free(ptVar15);
  tnt_stream_free(ptVar8);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_msgpack_mapa_iter");
  fputc(10,_stdout);
  check_plan();
  ptVar8 = tnt_net((tnt_stream *)0x0);
  if (ptVar8 == (tnt_stream *)0x0) {
    __assert_fail("tnt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x315,"int test_pushes(const char *)");
  }
  iVar4 = tnt_set(ptVar8,0,acStack_188);
  if (iVar4 == -1) {
    __assert_fail("rv != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x317,"int test_pushes(const char *)");
  }
  iVar4 = tnt_connect(ptVar8);
  if (iVar4 == -1) {
    __assert_fail("rv != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x319,"int test_pushes(const char *)");
  }
  iVar4 = 0;
  ptVar11 = tnt_request_call((tnt_request *)0x0);
  tnt_request_set_funcz(ptVar11,"test_5");
  tnt_request_compile(ptVar8,ptVar11);
  tnt_flush(ptVar8);
  tnt_iter_reply((tnt_iter *)(uri + 0x78),ptVar8);
  _Var3 = true;
  bVar20 = 0;
  while (iVar5 = tnt_next((tnt_iter *)(uri + 0x78)), iVar5 != 0) {
    if (bVar20 != 0) {
      __assert_fail("ended == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                    ,0x326,"int test_pushes(const char *)");
    }
    if ((local_b8 & 0x80) == 0) {
      bVar20 = *local_90;
      if (mp_type_hint[bVar20] != MP_ARRAY) {
        __assert_fail("mp_typeof(*pos) == MP_ARRAY",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                      ,0x32c,"int test_pushes(const char *)");
      }
      local_40 = local_90 + 1;
      if ((bVar20 & 0x40) == 0) {
        uVar6 = bVar20 & 0xf;
      }
      else if ((bVar20 & 1) == 0) {
        local_40 = local_90 + 3;
        uVar6 = (uint)(ushort)(*(ushort *)(local_90 + 1) << 8 | *(ushort *)(local_90 + 1) >> 8);
      }
      else {
        uVar6 = *(uint *)(local_90 + 1);
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        local_40 = local_90 + 5;
      }
      if (uVar6 != 1) {
        __assert_fail("len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                      ,0x32e,"int test_pushes(const char *)");
      }
      if (mp_type_hint[*local_40] != MP_BOOL) {
        __assert_fail("mp_typeof(*pos) == MP_BOOL",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                      ,0x32f,"int test_pushes(const char *)");
      }
      _Var3 = mp_decode_bool((char **)&local_40);
      bVar20 = 1;
    }
    else {
      iVar4 = iVar4 + 1;
    }
  }
  tnt_request_free(ptVar11);
  tnt_close(ptVar8);
  tnt_stream_free(ptVar8);
  plan(2);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_pushes");
  fputc(10,_stdout);
  if (_Var3 == false) {
    iVar4 = __ok(1,"Skipping: server don\'t support pushes");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("Skipping: server don\'t support pushes",0x25,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x33f);
    }
    iVar4 = __ok(1,"Skipping: server don\'t support pushes");
    if (iVar4 != 0) goto LAB_00108138;
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Skipping: server don\'t support pushes",0x25,1,_stderr);
    uVar21 = 0x340;
  }
  else {
    iVar4 = __ok((uint)(iVar4 == 10),"Got 10 results");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("Got 10 results",0xe,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x33c);
    }
    iVar4 = __ok((uint)bVar20,"Received response from server");
    if (iVar4 != 0) goto LAB_00108138;
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Received response from server",0x1d,1,_stderr);
    uVar21 = 0x33d;
  }
  fwrite("\'\n",2,1,_stderr);
  __space((FILE *)_stderr);
  fprintf(_stderr,"#   in %s at line %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
          ,uVar21);
LAB_00108138:
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_pushes");
  fputc(10,_stdout);
  check_plan();
  plan(0x14);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_object_format_uint");
  fputc(10,_stdout);
  ptVar8 = tnt_net((tnt_stream *)0x0);
  if (ptVar8 == (tnt_stream *)0x0) {
    __assert_fail("tnt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x36d,"int test_object_format_uint(const char *)");
  }
  pcVar7 = (char *)0x0;
  iVar4 = tnt_set(ptVar8,0,acStack_188);
  if (iVar4 != 0) {
    __assert_fail("rc == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x36f,"int test_object_format_uint(const char *)");
  }
  iVar4 = tnt_connect(ptVar8);
  if (iVar4 != 0) {
    __assert_fail("rc == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x371,"int test_object_format_uint(const char *)");
  }
  call_helper(ptVar8,pcVar7,"[%hhu]",0xff);
  call_helper(ptVar8,pcVar7,"[%hu]",0xffff);
  call_helper(ptVar8,pcVar7,"[%u]",0xffffffffffffffff);
  call_helper(ptVar8,pcVar7,"[%lu]",0xffffffffffffffff);
  call_helper(ptVar8,pcVar7,"[%llu]",0xffffffffffffffff);
  tnt_flush(ptVar8);
  uVar6 = 0;
  while( true ) {
    if (uVar6 == 5) {
      tnt_close(ptVar8);
      tnt_stream_free(ptVar8);
      __space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fprintf(_stdout,"*** %s: done ***","test_object_format_uint");
      fputc(10,_stdout);
      check_plan();
      iVar4 = check_plan();
      return iVar4;
    }
    __space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fprintf(_stdout,"*** verify %d response: prep ***",(ulong)uVar6);
    fputc(10,_stdout);
    ptVar14 = tnt_reply_init((tnt_reply *)0x0);
    (*ptVar8->read_reply)(ptVar8,ptVar14);
    uri._120_8_ = ptVar14->data;
    if ((byte *)uri._120_8_ == (byte *)0x0) break;
    iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_ARRAY),"reply data is array");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("reply data is array",0x13,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x38a);
    }
    bVar20 = *(byte *)uri._120_8_;
    if ((bVar20 & 0x40) == 0) {
      uVar18 = bVar20 & 0xf;
      uri._120_8_ = uri._120_8_ + 1;
    }
    else if ((bVar20 & 1) == 0) {
      puVar1 = (ushort *)(uri._120_8_ + 1);
      uri._120_8_ = uri._120_8_ + 3;
      uVar18 = (uint)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
    }
    else {
      uVar18 = *(uint *)(uri._120_8_ + 1);
      uVar18 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      uri._120_8_ = uri._120_8_ + 5;
    }
    iVar4 = __ok((uint)(uVar18 == 1),"reply data array size is 1");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("reply data array size is 1",0x1a,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x38b);
    }
    iVar4 = __ok((uint)(mp_type_hint[*(byte *)uri._120_8_] == MP_BOOL),"result is boolean");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("result is boolean",0x11,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x38c);
    }
    _Var3 = mp_decode_bool((char **)(uri + 0x78));
    iVar4 = __ok((uint)_Var3,"result is true");
    if (iVar4 == 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("result is true",0xe,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
              ,0x38d);
    }
    tnt_reply_free(ptVar14);
    __space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fprintf(_stdout,"*** verify %d response: done ***",(ulong)uVar6);
    fputc(10,_stdout);
    uVar6 = uVar6 + 1;
  }
  __assert_fail("data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                ,0x389,"int test_object_format_uint(const char *)");
}

Assistant:

int main() {
	plan(11);

	char uri[128] = {0};
	snprintf(uri, 128, "test:test@%s", getenv("LISTEN"));

	test_connect_tcp(uri);
	test_object();
	test_request_01(uri);
	test_request_02(uri);
	test_request_03(uri);
	test_request_04(uri);
	test_request_05(uri);
	test_msgpack_array_iter();
	test_msgpack_mapa_iter();
	test_pushes(uri);
	test_object_format_uint(uri);

	return check_plan();
}